

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleRegexCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_110 [8];
  string e;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined4 local_a0;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  string mode;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command REGEX requires a mode to be specified.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"MATCH");
    if (bVar1) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar2 < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_98,
                   "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.",
                   &local_99);
        cmCommand::SetError(&this->super_cmCommand,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        this_local._7_1_ = 0;
        local_a0 = 1;
      }
      else {
        this_local._7_1_ = RegexMatch(this,local_20);
        local_a0 = 1;
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,"MATCHALL");
      if (bVar1) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20);
        if (sVar2 < 5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_c0,
                     "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command."
                     ,&local_c1);
          cmCommand::SetError(&this->super_cmCommand,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
          this_local._7_1_ = 0;
          local_a0 = 1;
        }
        else {
          this_local._7_1_ = RegexMatchAll(this,local_20);
          local_a0 = 1;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,"REPLACE");
        if (bVar1) {
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
          if (sVar2 < 6) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_e8,
                       "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command."
                       ,(allocator *)(e.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 0;
            local_a0 = 1;
          }
          else {
            this_local._7_1_ = RegexReplace(this,local_20);
            local_a0 = 1;
          }
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,"sub-command REGEX does not recognize mode ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_110);
          this_local._7_1_ = 0;
          local_a0 = 1;
          std::__cxx11::string::~string((string *)local_110);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleRegexCommand(std::vector<std::string> const& args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command REGEX requires a mode to be specified.");
    return false;
    }
  std::string mode = args[1];
  if(mode == "MATCH")
    {
    if(args.size() < 5)
      {
      this->SetError("sub-command REGEX, mode MATCH needs "
                     "at least 5 arguments total to command.");
      return false;
      }
    return this->RegexMatch(args);
    }
  else if(mode == "MATCHALL")
    {
    if(args.size() < 5)
      {
      this->SetError("sub-command REGEX, mode MATCHALL needs "
                     "at least 5 arguments total to command.");
      return false;
      }
    return this->RegexMatchAll(args);
    }
  else if(mode == "REPLACE")
    {
    if(args.size() < 6)
      {
      this->SetError("sub-command REGEX, mode REPLACE needs "
                     "at least 6 arguments total to command.");
      return false;
      }
    return this->RegexReplace(args);
    }

  std::string e = "sub-command REGEX does not recognize mode "+mode;
  this->SetError(e);
  return false;
}